

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int iface_bind_old(int fd,char *device,char *ebuf)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  socklen_t local_38;
  int local_34;
  socklen_t errlen;
  int err;
  sockaddr saddr;
  char *ebuf_local;
  char *device_local;
  int fd_local;
  
  local_38 = 4;
  saddr.sa_data._6_8_ = ebuf;
  memset(&errlen,0,0x10);
  strncpy((char *)((long)&errlen + 2),device,0xe);
  saddr.sa_data[5] = '\0';
  iVar2 = bind(fd,(sockaddr *)&errlen,0x10);
  uVar1 = saddr.sa_data._6_8_;
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    pcVar4 = pcap_strerror(*piVar3);
    snprintf((char *)uVar1,0x100,"bind: %s",pcVar4);
    device_local._4_4_ = -1;
  }
  else {
    iVar2 = getsockopt(fd,1,4,&local_34,&local_38);
    uVar1 = saddr.sa_data._6_8_;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = pcap_strerror(*piVar3);
      snprintf((char *)uVar1,0x100,"getsockopt: %s",pcVar4);
      device_local._4_4_ = -1;
    }
    else if (local_34 < 1) {
      device_local._4_4_ = 0;
    }
    else {
      pcVar4 = pcap_strerror(local_34);
      snprintf((char *)uVar1,0x100,"bind: %s",pcVar4);
      device_local._4_4_ = -1;
    }
  }
  return device_local._4_4_;
}

Assistant:

static int
iface_bind_old(int fd, const char *device, char *ebuf)
{
	struct sockaddr	saddr;
	int		err;
	socklen_t	errlen = sizeof(err);

	memset(&saddr, 0, sizeof(saddr));
	strlcpy(saddr.sa_data, device, sizeof(saddr.sa_data));
	if (bind(fd, &saddr, sizeof(saddr)) == -1) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			 "bind: %s", pcap_strerror(errno));
		return -1;
	}

	/* Any pending errors, e.g., network is down? */

	if (getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen) == -1) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			"getsockopt: %s", pcap_strerror(errno));
		return -1;
	}

	if (err > 0) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			"bind: %s", pcap_strerror(err));
		return -1;
	}

	return 0;
}